

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  byte *srcBuffer;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  char cVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  byte bVar15;
  ulong uVar16;
  undefined2 *puVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  undefined2 *puVar25;
  undefined4 in_register_0000008c;
  undefined2 *puVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  bool bVar33;
  uint local_14c;
  uint local_144;
  size_t *local_138;
  ulong *local_130;
  ulong local_128;
  ulong local_120;
  BIT_DStream_t local_118;
  ulong *local_f0;
  ulong *local_e8;
  ulong local_e0;
  ulong *local_d8;
  undefined2 *local_d0;
  undefined2 *local_c8;
  undefined2 *local_c0;
  undefined2 *local_b8;
  ulong *local_b0;
  undefined2 *local_a8;
  ulong *local_a0;
  ulong *local_90;
  size_t local_88;
  ulong *local_80;
  ulong *local_78;
  int local_6c;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar14 = HUF_decompress4X2_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar14 != 0)) {
      return sVar14;
    }
    sVar14 = HUF_decompress4X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar14;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar24 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar16 = (ulong)uVar5;
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar13 = (ulong)uVar6;
  uVar19 = uVar24 + uVar16 + uVar13 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar19) {
    return 0xffffffffffffffec;
  }
  local_b8 = (undefined2 *)(dstSize + (long)dst);
  uVar29 = dstSize + 3 >> 2;
  local_c8 = (undefined2 *)(uVar29 + (long)dst);
  local_c0 = (undefined2 *)((long)local_c8 + uVar29);
  local_a8 = (undefined2 *)(uVar29 + (long)local_c0);
  if (local_b8 < local_a8) {
    return 0xffffffffffffffec;
  }
  local_e8 = (ulong *)((long)cSrc + uVar24 + 6);
  uVar18 = *DTable;
  if (uVar24 == 0) {
    local_d8 = (ulong *)0x0;
    local_f0 = (ulong *)0x0;
    local_80 = (ulong *)0x0;
    uVar27 = 0;
    local_120 = 0;
    uVar29 = 0xffffffffffffffb8;
  }
  else {
    local_f0 = (ulong *)((long)cSrc + 6);
    local_80 = (ulong *)((long)cSrc + 0xe);
    if (uVar4 < 8) {
      local_120 = (ulong)*(byte *)local_f0;
      switch(uVar4) {
      case 7:
        local_120 = local_120 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      case 6:
        local_120 = local_120 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
      case 5:
        local_120 = local_120 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      case 4:
        local_120 = local_120 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
      case 3:
        local_120 = local_120 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
      case 2:
        local_120 = local_120 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
      default:
        bVar15 = *(byte *)((long)cSrc + uVar24 + 5);
        uVar27 = 0x1f;
        if (bVar15 != 0) {
          for (; bVar15 >> uVar27 == 0; uVar27 = uVar27 - 1) {
          }
        }
        local_d8 = local_f0;
        if (bVar15 == 0) {
          uVar29 = 0xffffffffffffffec;
          uVar27 = 0;
        }
        else {
          uVar27 = ~uVar27 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
          uVar29 = uVar24;
        }
      }
    }
    else {
      local_d8 = (ulong *)((long)cSrc + (uVar24 - 2));
      local_120 = *(ulong *)((long)cSrc + (uVar24 - 2));
      bVar15 = *(byte *)((long)cSrc + uVar24 + 5);
      uVar27 = 0x1f;
      if (bVar15 != 0) {
        for (; bVar15 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = ~uVar27 + 9;
      if (bVar15 == 0) {
        uVar27 = 0;
      }
      uVar29 = uVar24 | -(ulong)(bVar15 == 0);
    }
  }
  if (0xffffffffffffff88 < uVar29) {
    return uVar29;
  }
  local_78 = (ulong *)((long)local_e8 + uVar16);
  if (uVar16 == 0) {
    uVar16 = 0xffffffffffffffb8;
    local_128 = 0;
    uVar20 = 0;
    local_b0 = (ulong *)0x0;
    local_e8 = (ulong *)0x0;
    local_90 = (ulong *)0x0;
  }
  else {
    local_90 = (ulong *)((long)cSrc + uVar24 + 0xe);
    if (7 < uVar5) {
      local_b0 = local_78 + -1;
      local_128 = local_78[-1];
      bVar15 = *(byte *)((long)local_78 + -1);
      uVar20 = 0x1f;
      if (bVar15 != 0) {
        for (; bVar15 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = ~uVar20 + 9;
      if (bVar15 == 0) {
        uVar20 = 0;
      }
      uVar16 = uVar16 | -(ulong)(bVar15 == 0);
      goto LAB_00192eaa;
    }
    local_128 = (ulong)(byte)*local_e8;
    switch(uVar5) {
    case 2:
      goto LAB_00192e4f;
    case 3:
      goto LAB_00192e44;
    case 4:
      goto LAB_00192e39;
    case 5:
      goto LAB_00192e2d;
    case 6:
      break;
    case 7:
      local_128 = local_128 | (ulong)*(byte *)((long)cSrc + uVar24 + 0xc) << 0x30;
      break;
    default:
      goto switchD_00192deb_default;
    }
    local_128 = local_128 + ((ulong)*(byte *)((long)cSrc + uVar24 + 0xb) << 0x28);
LAB_00192e2d:
    local_128 = local_128 + ((ulong)*(byte *)((long)cSrc + uVar24 + 10) << 0x20);
LAB_00192e39:
    local_128 = local_128 + (ulong)*(byte *)((long)cSrc + uVar24 + 9) * 0x1000000;
LAB_00192e44:
    local_128 = local_128 + (ulong)*(byte *)((long)cSrc + uVar24 + 8) * 0x10000;
LAB_00192e4f:
    local_128 = local_128 + (ulong)*(byte *)((long)cSrc + uVar24 + 7) * 0x100;
switchD_00192deb_default:
    bVar15 = *(byte *)((long)local_78 + -1);
    uVar20 = 0x1f;
    if (bVar15 != 0) {
      for (; bVar15 >> uVar20 == 0; uVar20 = uVar20 - 1) {
      }
    }
    local_b0 = local_e8;
    if (bVar15 == 0) {
      uVar16 = 0xffffffffffffffec;
      uVar20 = 0;
    }
    else {
      uVar20 = ~uVar20 + 9 + ((uint)uVar5 * -8 + 0x40 & 0xffff);
    }
  }
LAB_00192eaa:
  if (0xffffffffffffff88 < uVar16) {
    return uVar16;
  }
  srcBuffer = (byte *)((long)local_78 + uVar13);
  if (uVar13 == 0) {
    uVar13 = 0xffffffffffffffb8;
    uVar16 = 0;
    local_144 = 0;
    local_130 = (ulong *)0x0;
    local_78 = (ulong *)0x0;
    local_a0 = (ulong *)0x0;
  }
  else {
    local_a0 = local_78 + 1;
    if (uVar6 < 8) {
      uVar16 = (ulong)(byte)*local_78;
      switch(uVar6) {
      case 7:
        uVar16 = uVar16 | (ulong)*(byte *)((long)local_78 + 6) << 0x30;
      case 6:
        uVar16 = uVar16 + ((ulong)*(byte *)((long)local_78 + 5) << 0x28);
      case 5:
        uVar16 = uVar16 + ((ulong)*(byte *)((long)local_78 + 4) << 0x20);
      case 4:
        uVar16 = uVar16 + (ulong)*(byte *)((long)local_78 + 3) * 0x1000000;
      case 3:
        uVar16 = uVar16 + (ulong)*(byte *)((long)local_78 + 2) * 0x10000;
      case 2:
        uVar16 = uVar16 + (ulong)*(byte *)((long)local_78 + 1) * 0x100;
      default:
        bVar15 = srcBuffer[-1];
        uVar7 = 0x1f;
        if (bVar15 != 0) {
          for (; bVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        local_130 = local_78;
        if (bVar15 == 0) {
          uVar13 = 0xffffffffffffffec;
          local_144 = 0;
        }
        else {
          local_144 = ~uVar7 + 9 + ((uint)uVar6 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      uVar16 = *(ulong *)(srcBuffer + -8);
      bVar15 = srcBuffer[-1];
      uVar7 = 0x1f;
      if (bVar15 != 0) {
        for (; bVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      local_144 = ~uVar7 + 9;
      if (bVar15 == 0) {
        local_144 = 0;
      }
      uVar13 = uVar13 | -(ulong)(bVar15 == 0);
      local_130 = (ulong *)(srcBuffer + -8);
    }
  }
  if (0xffffffffffffff88 < uVar13) {
    return uVar13;
  }
  uVar13 = (ulong)uVar27;
  sVar14 = BIT_initDStream(&local_118,srcBuffer,cSrcSize - uVar19);
  if (0xffffffffffffff88 < sVar14) {
    return sVar14;
  }
  puVar17 = (undefined2 *)((long)dst + (dstSize - 7));
  cVar8 = (char)(uVar18 >> 0x10);
  puVar25 = local_a8;
  puVar26 = local_c0;
  if (local_a8 < puVar17 && 7 < (ulong)((long)local_b8 - (long)local_a8)) {
    local_88 = local_118.bitContainer;
    bVar15 = -cVar8 & 0x3f;
    local_138 = (size_t *)local_118.ptr;
    local_d0 = local_c8;
    do {
      uVar19 = (local_120 << ((byte)uVar13 & 0x3f)) >> bVar15;
      *(short *)dst = (short)DTable[uVar19 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + (int)uVar13;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
      uVar19 = (local_120 << ((byte)iVar21 & 0x3f)) >> bVar15;
      *(short *)((long)dst + uVar13) = (short)DTable[uVar19 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar21;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
      uVar29 = (local_120 << ((byte)iVar21 & 0x3f)) >> bVar15;
      *(short *)((long)dst + uVar24 + uVar13) = (short)DTable[uVar29 + 1];
      iVar21 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar21;
      uVar19 = (local_120 << ((byte)iVar21 & 0x3f)) >> bVar15;
      lVar9 = uVar24 + uVar13;
      uVar29 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
      *(short *)((long)dst + uVar29 + lVar9) = (short)DTable[uVar19 + 1];
      bVar1 = *(byte *)((long)DTable + uVar19 * 4 + 6);
      bVar2 = *(byte *)((long)DTable + uVar19 * 4 + 7);
      uVar13 = (local_128 << ((byte)uVar20 & 0x3f)) >> bVar15;
      *local_d0 = (short)DTable[uVar13 + 1];
      iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar20;
      uVar19 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
      uVar27 = (uint)bVar1 + iVar21;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      *(short *)((long)local_d0 + uVar13) = (short)DTable[uVar19 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
      uVar24 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
      uVar19 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
      *(short *)((long)local_d0 + uVar19 + uVar13) = (short)DTable[uVar24 + 1];
      lVar10 = uVar19 + uVar13;
      iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22;
      uVar19 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar13 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)local_d0 + uVar19 + lVar10) = (short)DTable[uVar13 + 1];
      iVar21 = 3;
      if (local_d8 < local_80) {
        local_6c = 3;
      }
      else {
        local_d8 = (ulong *)((long)local_d8 - (ulong)(uVar27 >> 3));
        uVar27 = uVar27 & 7;
        local_120 = *local_d8;
        local_6c = 0;
      }
      uVar20 = iVar22 + (uint)*(byte *)((long)DTable + uVar13 * 4 + 6);
      bVar1 = *(byte *)((long)DTable + uVar13 * 4 + 7);
      if (local_90 <= local_b0) {
        local_b0 = (ulong *)((long)local_b0 - (ulong)(uVar20 >> 3));
        uVar20 = uVar20 & 7;
        local_128 = *local_b0;
        iVar21 = 0;
      }
      uVar13 = (uVar16 << ((byte)local_144 & 0x3f)) >> bVar15;
      *puVar26 = (short)DTable[uVar13 + 1];
      iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_144;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar13 = (uVar16 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar26 + uVar24) = (short)DTable[uVar13 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
      uVar30 = (uVar16 << ((byte)iVar22 & 0x3f)) >> bVar15;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      lVar11 = uVar13 + uVar24;
      *(short *)((long)puVar26 + uVar13 + uVar24) = (short)DTable[uVar30 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar30 * 4 + 6) + iVar22;
      uVar28 = (ulong)*(byte *)((long)DTable + uVar30 * 4 + 7);
      uVar13 = (uVar16 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar26 + uVar28 + lVar11) = (short)DTable[uVar13 + 1];
      uVar24 = (local_88 << ((byte)local_118.bitsConsumed & 0x3f)) >> bVar15;
      local_144 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
      bVar3 = *(byte *)((long)DTable + uVar13 * 4 + 7);
      *puVar25 = (short)DTable[uVar24 + 1];
      iVar22 = *(byte *)((long)DTable + uVar24 * 4 + 6) + local_118.bitsConsumed;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar24 = (local_88 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar25 + uVar13) = (short)DTable[uVar24 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      uVar31 = (local_88 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar25 + uVar24 + uVar13) = (short)DTable[uVar31 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar31 * 4 + 6) + iVar22;
      uVar30 = (local_88 << ((byte)iVar22 & 0x3f)) >> bVar15;
      lVar12 = uVar24 + uVar13;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar31 * 4 + 7);
      *(short *)((long)puVar25 + uVar24 + lVar12) = (short)DTable[uVar30 + 1];
      iVar23 = 3;
      if (local_130 < local_a0) {
        iVar32 = 3;
      }
      else {
        local_130 = (ulong *)((long)local_130 - (ulong)(local_144 >> 3));
        local_144 = local_144 & 7;
        uVar16 = *local_130;
        iVar32 = 0;
      }
      local_118.bitsConsumed = iVar22 + (uint)*(byte *)((long)DTable + uVar30 * 4 + 6);
      if (local_118.limitPtr <= local_138) {
        local_138 = (size_t *)((long)local_138 - (ulong)(local_118.bitsConsumed >> 3));
        local_118.bitsConsumed = local_118.bitsConsumed & 7;
        local_118.bitContainer = *local_138;
        iVar23 = 0;
        local_118.ptr = (char *)local_138;
        local_88 = local_118.bitContainer;
      }
      uVar13 = (ulong)uVar27;
      dst = (void *)((long)dst + (ulong)bVar2 + uVar29 + lVar9);
      local_d0 = (undefined2 *)((long)local_d0 + (ulong)bVar1 + uVar19 + lVar10);
      puVar26 = (undefined2 *)((long)puVar26 + (ulong)bVar3 + uVar28 + lVar11);
      puVar25 = (undefined2 *)
                ((long)puVar25 + (ulong)*(byte *)((long)DTable + uVar30 * 4 + 7) + uVar24 + lVar12);
    } while ((puVar25 < puVar17) && (((iVar21 == 0 && local_6c == 0) && iVar32 == 0) && iVar23 == 0)
            );
  }
  else {
    local_d0 = local_c8;
  }
  if ((local_c8 < dst) || (local_c0 < local_d0)) {
    return 0xffffffffffffffec;
  }
  if (local_a8 < puVar26) {
    return 0xffffffffffffffec;
  }
  uVar18 = uVar18 >> 0x10 & 0xff;
  iVar21 = (int)local_f0;
  if (7 < (ulong)((long)local_c8 - (long)dst)) {
    bVar15 = -cVar8 & 0x3f;
    if (0xb < uVar18) {
      do {
        local_14c = (uint)uVar13;
        if (local_14c < 0x41) {
          if (local_d8 < local_80) {
            if (local_d8 == local_f0) {
              bVar33 = false;
              goto LAB_00193900;
            }
            bVar33 = local_f0 <= (ulong *)((long)local_d8 - (ulong)(local_14c >> 3));
            uVar27 = (int)local_d8 - iVar21;
            if (bVar33) {
              uVar27 = local_14c >> 3;
            }
            local_14c = local_14c + uVar27 * -8;
          }
          else {
            uVar27 = (uint)(uVar13 >> 3);
            local_14c = local_14c & 7;
            bVar33 = true;
          }
          local_d8 = (ulong *)((long)local_d8 - (ulong)uVar27);
          local_120 = *local_d8;
        }
        else {
          bVar33 = false;
        }
LAB_00193900:
        if (((undefined2 *)((long)local_c8 + -7) <= dst) || (!bVar33)) goto LAB_00193a04;
        uVar13 = (local_120 << ((byte)local_14c & 0x3f)) >> bVar15;
        *(short *)dst = (short)DTable[uVar13 + 1];
        iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_14c;
        uVar19 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        uVar13 = (local_120 << ((byte)iVar22 & 0x3f)) >> bVar15;
        *(short *)((long)dst + uVar19) = (short)DTable[uVar13 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        lVar9 = uVar13 + uVar19;
        uVar29 = (local_120 << ((byte)iVar22 & 0x3f)) >> bVar15;
        *(short *)((long)dst + uVar13 + uVar19) = (short)DTable[uVar29 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar22;
        uVar24 = (local_120 << ((byte)iVar22 & 0x3f)) >> bVar15;
        uVar19 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
        *(short *)((long)dst + uVar19 + lVar9) = (short)DTable[uVar24 + 1];
        uVar13 = (ulong)((uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22);
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7) + uVar19 + lVar9)
        ;
      } while( true );
    }
    do {
      local_14c = (uint)uVar13;
      if (local_14c < 0x41) {
        if (local_d8 < local_80) {
          if (local_d8 == local_f0) {
            bVar33 = false;
            goto LAB_001936b3;
          }
          bVar33 = local_f0 <= (ulong *)((long)local_d8 - (ulong)(local_14c >> 3));
          uVar27 = (int)local_d8 - iVar21;
          if (bVar33) {
            uVar27 = local_14c >> 3;
          }
          local_14c = local_14c + uVar27 * -8;
        }
        else {
          uVar27 = (uint)(uVar13 >> 3);
          local_14c = local_14c & 7;
          bVar33 = true;
        }
        local_d8 = (ulong *)((long)local_d8 - (ulong)uVar27);
        local_120 = *local_d8;
      }
      else {
        bVar33 = false;
      }
LAB_001936b3:
      if (((undefined2 *)((long)local_c8 + -9) <= dst) || (!bVar33)) goto LAB_00193a04;
      uVar13 = (local_120 << ((byte)local_14c & 0x3f)) >> bVar15;
      *(short *)dst = (short)DTable[uVar13 + 1];
      iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_14c;
      uVar19 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar13 = (local_120 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)dst + uVar19) = (short)DTable[uVar13 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      lVar9 = uVar13 + uVar19;
      uVar24 = (local_120 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)dst + uVar13 + uVar19) = (short)DTable[uVar24 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      lVar10 = uVar13 + lVar9;
      uVar19 = (local_120 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)dst + uVar13 + lVar9) = (short)DTable[uVar19 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
      uVar24 = (local_120 << ((byte)iVar22 & 0x3f)) >> bVar15;
      uVar19 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
      *(short *)((long)dst + uVar19 + lVar10) = (short)DTable[uVar24 + 1];
      uVar13 = (ulong)((uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7) + uVar19 + lVar10);
    } while( true );
  }
  local_14c = (uint)uVar13;
  if (local_14c < 0x41) {
    if (local_d8 < local_80) {
      if (local_d8 == local_f0) goto LAB_00193a04;
      uVar27 = (int)local_d8 - iVar21;
      if (local_f0 <= (ulong *)((long)local_d8 - (ulong)(local_14c >> 3))) {
        uVar27 = local_14c >> 3;
      }
      local_14c = local_14c + uVar27 * -8;
    }
    else {
      uVar27 = local_14c >> 3;
      local_14c = local_14c & 7;
    }
    local_d8 = (ulong *)((long)local_d8 - (ulong)uVar27);
    local_120 = *local_d8;
  }
LAB_00193a04:
  if (1 < (ulong)((long)local_c8 - (long)dst)) {
    do {
      if (local_14c < 0x41) {
        if (local_d8 < local_80) {
          if (local_d8 == local_f0) {
            bVar33 = false;
            goto LAB_00193abf;
          }
          bVar33 = local_f0 <= (ulong *)((long)local_d8 - (ulong)(local_14c >> 3));
          uVar27 = (int)local_d8 - iVar21;
          if (bVar33) {
            uVar27 = local_14c >> 3;
          }
          local_14c = local_14c + uVar27 * -8;
        }
        else {
          uVar27 = local_14c >> 3;
          local_14c = local_14c & 7;
          bVar33 = true;
        }
        local_d8 = (ulong *)((long)local_d8 - (ulong)uVar27);
        local_120 = *local_d8;
      }
      else {
        bVar33 = false;
      }
LAB_00193abf:
      if ((local_c8 + -1 < dst) || (!bVar33)) goto joined_r0x00193b0c;
      uVar13 = (local_120 << ((byte)local_14c & 0x3f)) >> (-cVar8 & 0x3fU);
      *(short *)dst = (short)DTable[uVar13 + 1];
      local_14c = local_14c + *(byte *)((long)DTable + uVar13 * 4 + 6);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
    } while( true );
  }
LAB_00193b6d:
  if (dst < local_c8) {
    uVar13 = (local_120 << ((byte)local_14c & 0x3f)) >> (-cVar8 & 0x3fU);
    *(char *)dst = (char)DTable[uVar13 + 1];
    if (*(char *)((long)DTable + uVar13 * 4 + 7) == '\x01') {
      local_14c = local_14c + *(byte *)((long)DTable + uVar13 * 4 + 6);
    }
    else if ((local_14c < 0x40) &&
            (local_14c = local_14c + *(byte *)((long)DTable + uVar13 * 4 + 6), 0x3f < local_14c)) {
      local_14c = 0x40;
    }
  }
  iVar21 = (int)local_e8;
  if (7 < (ulong)((long)local_c0 - (long)local_d0)) {
    bVar15 = -cVar8 & 0x3f;
    if (0xb < uVar18) {
      do {
        if (uVar20 < 0x41) {
          if (local_b0 < local_90) {
            if (local_b0 == local_e8) {
              bVar33 = false;
              goto LAB_00193e39;
            }
            bVar33 = local_e8 <= (ulong *)((long)local_b0 - (ulong)(uVar20 >> 3));
            uVar27 = (int)local_b0 - iVar21;
            if (bVar33) {
              uVar27 = uVar20 >> 3;
            }
            uVar20 = uVar20 + uVar27 * -8;
          }
          else {
            uVar27 = uVar20 >> 3;
            uVar20 = uVar20 & 7;
            bVar33 = true;
          }
          local_b0 = (ulong *)((long)local_b0 - (ulong)uVar27);
          local_128 = *local_b0;
        }
        else {
          bVar33 = false;
        }
LAB_00193e39:
        if (((undefined2 *)((long)local_c0 - 7U) <= local_d0) || (!bVar33)) goto LAB_00193f1a;
        uVar13 = (local_128 << ((byte)uVar20 & 0x3f)) >> bVar15;
        *local_d0 = (short)DTable[uVar13 + 1];
        iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar20;
        uVar19 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        uVar13 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
        *(short *)((long)local_d0 + uVar19) = (short)DTable[uVar13 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        lVar9 = uVar13 + uVar19;
        uVar24 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
        *(short *)((long)local_d0 + uVar13 + uVar19) = (short)DTable[uVar24 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22;
        uVar19 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
        *(short *)((long)local_d0 + uVar13 + lVar9) = (short)DTable[uVar19 + 1];
        uVar20 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
        local_d0 = (undefined2 *)
                   ((long)local_d0 +
                   (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7) + uVar13 + lVar9);
      } while( true );
    }
    do {
      if (uVar20 < 0x41) {
        if (local_b0 < local_90) {
          if (local_b0 == local_e8) {
            bVar33 = false;
            goto LAB_00193c5e;
          }
          bVar33 = local_e8 <= (ulong *)((long)local_b0 - (ulong)(uVar20 >> 3));
          uVar27 = (int)local_b0 - iVar21;
          if (bVar33) {
            uVar27 = uVar20 >> 3;
          }
          uVar20 = uVar20 + uVar27 * -8;
        }
        else {
          uVar27 = uVar20 >> 3;
          uVar20 = uVar20 & 7;
          bVar33 = true;
        }
        local_b0 = (ulong *)((long)local_b0 - (ulong)uVar27);
        local_128 = *local_b0;
      }
      else {
        bVar33 = false;
      }
LAB_00193c5e:
      if (((undefined2 *)((long)local_c0 - 9U) <= local_d0) || (!bVar33)) goto LAB_00193f1a;
      uVar13 = (local_128 << ((byte)uVar20 & 0x3f)) >> bVar15;
      *local_d0 = (short)DTable[uVar13 + 1];
      iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar20;
      uVar19 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar13 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)local_d0 + uVar19) = (short)DTable[uVar13 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      lVar9 = uVar13 + uVar19;
      uVar24 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)local_d0 + uVar13 + uVar19) = (short)DTable[uVar24 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      lVar10 = uVar13 + lVar9;
      uVar24 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)local_d0 + uVar13 + lVar9) = (short)DTable[uVar24 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 4 + 6) + iVar22;
      uVar19 = (local_128 << ((byte)iVar22 & 0x3f)) >> bVar15;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7);
      *(short *)((long)local_d0 + uVar13 + lVar10) = (short)DTable[uVar19 + 1];
      uVar20 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
      local_d0 = (undefined2 *)
                 ((long)local_d0 + (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7) + uVar13 + lVar10
                 );
    } while( true );
  }
  if (uVar20 < 0x41) {
    if (local_b0 < local_90) {
      if (local_b0 == local_e8) goto LAB_00193f1a;
      uVar27 = (int)local_b0 - iVar21;
      if (local_e8 <= (ulong *)((long)local_b0 - (ulong)(uVar20 >> 3))) {
        uVar27 = uVar20 >> 3;
      }
      uVar20 = uVar20 + uVar27 * -8;
    }
    else {
      uVar27 = uVar20 >> 3;
      uVar20 = uVar20 & 7;
    }
    local_b0 = (ulong *)((long)local_b0 - (ulong)uVar27);
    local_128 = *local_b0;
  }
LAB_00193f1a:
  if (1 < (ulong)((long)local_c0 - (long)local_d0)) {
    do {
      if (uVar20 < 0x41) {
        if (local_b0 < local_90) {
          if (local_b0 == local_e8) goto LAB_00193f45;
          bVar33 = local_e8 <= (ulong *)((long)local_b0 - (ulong)(uVar20 >> 3));
          uVar27 = (int)local_b0 - iVar21;
          if (bVar33) {
            uVar27 = uVar20 >> 3;
          }
          uVar20 = uVar20 + uVar27 * -8;
        }
        else {
          uVar27 = uVar20 >> 3;
          uVar20 = uVar20 & 7;
          bVar33 = true;
        }
        local_b0 = (ulong *)((long)local_b0 - (ulong)uVar27);
        local_128 = *local_b0;
      }
      else {
LAB_00193f45:
        bVar33 = false;
      }
      if ((local_c0 + -1 < local_d0) || (!bVar33)) goto joined_r0x00193fd5;
      uVar13 = (local_128 << ((byte)uVar20 & 0x3f)) >> (-cVar8 & 0x3fU);
      *local_d0 = (short)DTable[uVar13 + 1];
      uVar20 = uVar20 + *(byte *)((long)DTable + uVar13 * 4 + 6);
      local_d0 = (undefined2 *)((long)local_d0 + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
    } while( true );
  }
LAB_0019401e:
  if (local_d0 < local_c0) {
    uVar13 = (local_128 << ((byte)uVar20 & 0x3f)) >> (-cVar8 & 0x3fU);
    *(char *)local_d0 = (char)DTable[uVar13 + 1];
    if (*(char *)((long)DTable + uVar13 * 4 + 7) == '\x01') {
      uVar20 = uVar20 + *(byte *)((long)DTable + uVar13 * 4 + 6);
    }
    else if ((uVar20 < 0x40) &&
            (uVar20 = uVar20 + *(byte *)((long)DTable + uVar13 * 4 + 6), 0x3f < uVar20)) {
      uVar20 = 0x40;
    }
  }
  iVar21 = (int)local_78;
  local_e0 = uVar16;
  if (7 < (ulong)((long)local_a8 - (long)puVar26)) {
    bVar15 = -cVar8 & 0x3f;
    if (0xb < uVar18) {
      do {
        if (local_144 < 0x41) {
          if (local_130 < local_a0) {
            if (local_130 == local_78) {
              bVar33 = false;
              goto LAB_00194303;
            }
            bVar33 = local_78 <= (ulong *)((long)local_130 - (ulong)(local_144 >> 3));
            uVar27 = (int)local_130 - iVar21;
            if (bVar33) {
              uVar27 = local_144 >> 3;
            }
            local_144 = local_144 + uVar27 * -8;
          }
          else {
            uVar27 = local_144 >> 3;
            local_144 = local_144 & 7;
            bVar33 = true;
          }
          local_130 = (ulong *)((long)local_130 - (ulong)uVar27);
          local_e0 = *local_130;
        }
        else {
          bVar33 = false;
        }
LAB_00194303:
        if (((undefined2 *)((long)local_a8 - 7U) <= puVar26) || (!bVar33)) goto LAB_001943fb;
        uVar13 = (local_e0 << ((byte)local_144 & 0x3f)) >> bVar15;
        *puVar26 = (short)DTable[uVar13 + 1];
        iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_144;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        uVar13 = (local_e0 << ((byte)iVar22 & 0x3f)) >> bVar15;
        *(short *)((long)puVar26 + uVar16) = (short)DTable[uVar13 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        lVar9 = uVar13 + uVar16;
        uVar19 = (local_e0 << ((byte)iVar22 & 0x3f)) >> bVar15;
        *(short *)((long)puVar26 + uVar13 + uVar16) = (short)DTable[uVar19 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
        uVar16 = (local_e0 << ((byte)iVar22 & 0x3f)) >> bVar15;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
        *(short *)((long)puVar26 + uVar13 + lVar9) = (short)DTable[uVar16 + 1];
        local_144 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar22;
        puVar26 = (undefined2 *)
                  ((long)puVar26 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + uVar13 + lVar9)
        ;
      } while( true );
    }
    do {
      if (local_144 < 0x41) {
        if (local_130 < local_a0) {
          if (local_130 == local_78) {
            bVar33 = false;
            goto LAB_0019412c;
          }
          bVar33 = local_78 <= (ulong *)((long)local_130 - (ulong)(local_144 >> 3));
          uVar27 = (int)local_130 - iVar21;
          if (bVar33) {
            uVar27 = local_144 >> 3;
          }
          local_144 = local_144 + uVar27 * -8;
        }
        else {
          uVar27 = local_144 >> 3;
          local_144 = local_144 & 7;
          bVar33 = true;
        }
        local_130 = (ulong *)((long)local_130 - (ulong)uVar27);
        local_e0 = *local_130;
      }
      else {
        bVar33 = false;
      }
LAB_0019412c:
      if (((undefined2 *)((long)local_a8 - 9U) <= puVar26) || (!bVar33)) goto LAB_001943fb;
      uVar13 = (local_e0 << ((byte)local_144 & 0x3f)) >> bVar15;
      *puVar26 = (short)DTable[uVar13 + 1];
      iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_144;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar13 = (local_e0 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar26 + uVar16) = (short)DTable[uVar13 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      lVar9 = uVar13 + uVar16;
      uVar19 = (local_e0 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar26 + uVar13 + uVar16) = (short)DTable[uVar19 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
      lVar10 = uVar13 + lVar9;
      uVar16 = (local_e0 << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar26 + uVar13 + lVar9) = (short)DTable[uVar16 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar22;
      uVar19 = (local_e0 << ((byte)iVar22 & 0x3f)) >> bVar15;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      *(short *)((long)puVar26 + uVar13 + lVar10) = (short)DTable[uVar19 + 1];
      local_144 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
      puVar26 = (undefined2 *)
                ((long)puVar26 + (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7) + uVar13 + lVar10);
    } while( true );
  }
  if (local_144 < 0x41) {
    if (local_130 < local_a0) {
      if (local_130 == local_78) goto LAB_001943fb;
      uVar27 = (int)local_130 - iVar21;
      if (local_78 <= (ulong *)((long)local_130 - (ulong)(local_144 >> 3))) {
        uVar27 = local_144 >> 3;
      }
      local_144 = local_144 + uVar27 * -8;
    }
    else {
      uVar27 = local_144 >> 3;
      local_144 = local_144 & 7;
    }
    local_130 = (ulong *)((long)local_130 - (ulong)uVar27);
    local_e0 = *local_130;
  }
LAB_001943fb:
  if (1 < (ulong)((long)local_a8 - (long)puVar26)) {
    do {
      if (local_144 < 0x41) {
        if (local_130 < local_a0) {
          if (local_130 == local_78) {
            bVar33 = false;
            goto LAB_0019449b;
          }
          bVar33 = local_78 <= (ulong *)((long)local_130 - (ulong)(local_144 >> 3));
          uVar27 = (int)local_130 - iVar21;
          if (bVar33) {
            uVar27 = local_144 >> 3;
          }
          local_144 = local_144 + uVar27 * -8;
        }
        else {
          uVar27 = local_144 >> 3;
          local_144 = local_144 & 7;
          bVar33 = true;
        }
        local_130 = (ulong *)((long)local_130 - (ulong)uVar27);
        local_e0 = *local_130;
      }
      else {
        bVar33 = false;
      }
LAB_0019449b:
      if ((local_a8 + -1 < puVar26) || (!bVar33)) goto joined_r0x001944e2;
      uVar13 = (local_e0 << ((byte)local_144 & 0x3f)) >> (-cVar8 & 0x3fU);
      *puVar26 = (short)DTable[uVar13 + 1];
      local_144 = local_144 + *(byte *)((long)DTable + uVar13 * 4 + 6);
      puVar26 = (undefined2 *)((long)puVar26 + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
    } while( true );
  }
LAB_0019452e:
  if (puVar26 < local_a8) {
    uVar13 = (local_e0 << ((byte)local_144 & 0x3f)) >> (-cVar8 & 0x3fU);
    *(char *)puVar26 = (char)DTable[uVar13 + 1];
    if (*(char *)((long)DTable + uVar13 * 4 + 7) == '\x01') {
      local_144 = local_144 + *(byte *)((long)DTable + uVar13 * 4 + 6);
    }
    else if ((local_144 < 0x40) &&
            (local_144 = local_144 + *(byte *)((long)DTable + uVar13 * 4 + 6), 0x3f < local_144)) {
      local_144 = 0x40;
    }
  }
  iVar21 = (int)local_118.start;
  if ((ulong)((long)local_b8 - (long)puVar25) < 8) {
    if (local_118.bitsConsumed < 0x41) {
      if (local_118.ptr < local_118.limitPtr) {
        if (local_118.ptr == local_118.start) goto LAB_0019493c;
        uVar18 = (int)local_118.ptr - iVar21;
        if (local_118.start <=
            (size_t *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
          uVar18 = local_118.bitsConsumed >> 3;
        }
        local_118.bitsConsumed = local_118.bitsConsumed + uVar18 * -8;
      }
      else {
        uVar18 = local_118.bitsConsumed >> 3;
        local_118.bitsConsumed = local_118.bitsConsumed & 7;
      }
      local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar18);
      local_118.bitContainer = *(size_t *)local_118.ptr;
    }
  }
  else {
    if (uVar18 < 0xc) {
      bVar15 = -cVar8 & 0x3f;
      do {
        if (local_118.bitsConsumed < 0x41) {
          if (local_118.ptr < local_118.limitPtr) {
            if (local_118.ptr == local_118.start) goto LAB_001945c7;
            bVar33 = local_118.start <=
                     (size_t *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3));
            uVar18 = (int)local_118.ptr - iVar21;
            if (bVar33) {
              uVar18 = local_118.bitsConsumed >> 3;
            }
            local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar18);
            local_118.bitsConsumed = local_118.bitsConsumed + uVar18 * -8;
            local_118.bitContainer = *(size_t *)local_118.ptr;
          }
          else {
            local_118.ptr = (char *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3));
            local_118.bitsConsumed = local_118.bitsConsumed & 7;
            local_118.bitContainer = *(size_t *)local_118.ptr;
            bVar33 = true;
          }
        }
        else {
LAB_001945c7:
          bVar33 = false;
        }
        if (((undefined2 *)((long)local_b8 - 9U) <= puVar25) || (!bVar33)) goto LAB_0019493c;
        uVar13 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> bVar15;
        *puVar25 = (short)DTable[uVar13 + 1];
        iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_118.bitsConsumed;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        uVar16 = (local_118.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar15;
        *(short *)((long)puVar25 + uVar13) = (short)DTable[uVar16 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar22;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar19 = (local_118.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar15;
        lVar9 = uVar16 + uVar13;
        *(short *)((long)puVar25 + uVar16 + uVar13) = (short)DTable[uVar19 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
        uVar13 = (local_118.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar15;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
        *(short *)((long)puVar25 + uVar16 + lVar9) = (short)DTable[uVar13 + 1];
        iVar22 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar22;
        uVar19 = (local_118.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar15;
        lVar9 = uVar16 + lVar9;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        *(short *)((long)puVar25 + uVar13 + lVar9) = (short)DTable[uVar19 + 1];
        local_118.bitsConsumed = iVar22 + (uint)*(byte *)((long)DTable + uVar19 * 4 + 6);
        puVar25 = (undefined2 *)
                  ((long)puVar25 + (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7) + uVar13 + lVar9)
        ;
      } while( true );
    }
    bVar15 = -cVar8 & 0x3f;
    while( true ) {
      if (local_118.bitsConsumed < 0x41) {
        if (local_118.ptr < local_118.limitPtr) {
          if (local_118.ptr == local_118.start) {
            bVar33 = false;
          }
          else {
            bVar33 = local_118.start <=
                     (size_t *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3));
            uVar18 = (int)local_118.ptr - iVar21;
            if (bVar33) {
              uVar18 = local_118.bitsConsumed >> 3;
            }
            local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar18);
            local_118.bitsConsumed = local_118.bitsConsumed + uVar18 * -8;
            local_118.bitContainer = *(size_t *)local_118.ptr;
          }
        }
        else {
          local_118.ptr = (char *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3));
          local_118.bitsConsumed = local_118.bitsConsumed & 7;
          local_118.bitContainer = *(size_t *)local_118.ptr;
          bVar33 = true;
        }
      }
      else {
        bVar33 = false;
      }
      if ((puVar17 <= puVar25) || (!bVar33)) break;
      uVar13 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> bVar15;
      *puVar25 = (short)DTable[uVar13 + 1];
      iVar22 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_118.bitsConsumed;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar19 = (local_118.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar15;
      *(short *)((long)puVar25 + uVar13) = (short)DTable[uVar19 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar19 * 4 + 6) + iVar22;
      uVar16 = (local_118.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar15;
      uVar19 = (ulong)*(byte *)((long)DTable + uVar19 * 4 + 7);
      *(short *)((long)puVar25 + uVar19 + uVar13) = (short)DTable[uVar16 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar22;
      uVar24 = (local_118.bitContainer << ((byte)iVar22 & 0x3f)) >> bVar15;
      lVar9 = uVar19 + uVar13;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      *(short *)((long)puVar25 + uVar13 + lVar9) = (short)DTable[uVar24 + 1];
      local_118.bitsConsumed = iVar22 + (uint)*(byte *)((long)DTable + uVar24 * 4 + 6);
      puVar25 = (undefined2 *)
                ((long)puVar25 + (ulong)*(byte *)((long)DTable + uVar24 * 4 + 7) + uVar13 + lVar9);
    }
  }
LAB_0019493c:
  if (1 < (ulong)((long)local_b8 - (long)puVar25)) {
    do {
      if (local_118.bitsConsumed < 0x41) {
        if (local_118.ptr < local_118.limitPtr) {
          if (local_118.ptr == local_118.start) goto LAB_0019496b;
          bVar33 = local_118.start <=
                   (size_t *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3));
          uVar18 = (int)local_118.ptr - iVar21;
          if (bVar33) {
            uVar18 = local_118.bitsConsumed >> 3;
          }
          local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar18);
          local_118.bitsConsumed = local_118.bitsConsumed + uVar18 * -8;
          local_118.bitContainer = *(size_t *)local_118.ptr;
        }
        else {
          local_118.ptr = (char *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3));
          local_118.bitsConsumed = local_118.bitsConsumed & 7;
          local_118.bitContainer = *(size_t *)local_118.ptr;
          bVar33 = true;
        }
      }
      else {
LAB_0019496b:
        bVar33 = false;
      }
      if ((local_b8 + -1 < puVar25) || (!bVar33)) goto joined_r0x00194a29;
      uVar13 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> (-cVar8 & 0x3fU)
      ;
      *puVar25 = (short)DTable[uVar13 + 1];
      local_118.bitsConsumed = local_118.bitsConsumed + *(byte *)((long)DTable + uVar13 * 4 + 6);
      puVar25 = (undefined2 *)((long)puVar25 + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
    } while( true );
  }
LAB_00194a69:
  if (puVar25 < local_b8) {
    uVar13 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> (-cVar8 & 0x3fU);
    *(char *)puVar25 = (char)DTable[uVar13 + 1];
    if (*(char *)((long)DTable + uVar13 * 4 + 7) == '\x01') {
      local_118.bitsConsumed = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_118.bitsConsumed;
    }
    else if (local_118.bitsConsumed < 0x40) {
      uVar18 = local_118.bitsConsumed + *(byte *)((long)DTable + uVar13 * 4 + 6);
      local_118.bitsConsumed = 0x40;
      if (uVar18 < 0x40) {
        local_118.bitsConsumed = uVar18;
      }
    }
  }
  if (local_118.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_118.ptr != local_118.start) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_144 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_130 != local_78) {
    dstSize = 0xffffffffffffffec;
  }
  if (uVar20 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_b0 != local_e8) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_14c != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_d8 != local_f0) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
joined_r0x00193b0c:
  for (; dst <= local_c8 + -1;
      dst = (void *)((ulong)*(byte *)((long)DTable + uVar13 * 4 + 7) + (long)dst)) {
    uVar13 = (local_120 << ((byte)local_14c & 0x3f)) >> (-cVar8 & 0x3fU);
    *(short *)dst = (short)DTable[uVar13 + 1];
    local_14c = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_14c;
  }
  goto LAB_00193b6d;
joined_r0x00193fd5:
  for (; local_d0 <= local_c0 + -1;
      local_d0 = (undefined2 *)((ulong)*(byte *)((long)DTable + uVar13 * 4 + 7) + (long)local_d0)) {
    uVar13 = (local_128 << ((byte)uVar20 & 0x3f)) >> (-cVar8 & 0x3fU);
    *local_d0 = (short)DTable[uVar13 + 1];
    uVar20 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar20;
  }
  goto LAB_0019401e;
joined_r0x001944e2:
  for (; puVar26 <= local_a8 + -1;
      puVar26 = (undefined2 *)((ulong)*(byte *)((long)DTable + uVar13 * 4 + 7) + (long)puVar26)) {
    uVar13 = (local_e0 << ((byte)local_144 & 0x3f)) >> (-cVar8 & 0x3fU);
    *puVar26 = (short)DTable[uVar13 + 1];
    local_144 = *(byte *)((long)DTable + uVar13 * 4 + 6) + local_144;
  }
  goto LAB_0019452e;
joined_r0x00194a29:
  for (; puVar25 <= local_b8 + -1;
      puVar25 = (undefined2 *)((long)puVar25 + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7))) {
    uVar13 = (local_118.bitContainer << ((byte)local_118.bitsConsumed & 0x3f)) >> (-cVar8 & 0x3fU);
    *puVar25 = (short)DTable[uVar13 + 1];
    local_118.bitsConsumed = local_118.bitsConsumed + *(byte *)((long)DTable + uVar13 * 4 + 6);
  }
  goto LAB_00194a69;
}

Assistant:

static size_t HUF_decompress4X2_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X2_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X2_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X2_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X2_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}